

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O2

void __thiscall QtMWidgets::NavigationBar::showPreviousScreen(NavigationBar *this)

{
  Type *text;
  Data *dd;
  QStackedWidget *pQVar1;
  Data *dd_00;
  Data *dd_01;
  int iVar2;
  int iVar3;
  QSharedPointer<QtMWidgets::NavigationItem> *pQVar4;
  int *piVar5;
  NavigationBarPrivate *pNVar6;
  QWidget *local_38;
  
  pNVar6 = (this->d).d;
  if ((pNVar6->backStack).super_QList<int>.d.size == 0) {
    return;
  }
  QStack<int>::pop(&pNVar6->backStack);
  pNVar6 = (this->d).d;
  local_38 = (QWidget *)QStackedWidget::widget((int)pNVar6->stack);
  pQVar4 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                     (&pNVar6->itemsMap,&local_38);
  text = pQVar4->value;
  dd = pQVar4->d;
  if (dd != (Data *)0x0) {
    LOCK();
    (dd->weakref)._q_value.super___atomic_base<int>._M_i =
         (dd->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (dd->strongref)._q_value.super___atomic_base<int>._M_i =
         (dd->strongref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pNVar6 = (this->d).d;
  pQVar1 = pNVar6->stack;
  currentIndex(this);
  local_38 = (QWidget *)QStackedWidget::widget((int)pQVar1);
  pQVar4 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                     (&pNVar6->itemsMap,&local_38);
  dd_00 = pQVar4->d;
  if (dd_00 != (Data *)0x0) {
    LOCK();
    (dd_00->weakref)._q_value.super___atomic_base<int>._M_i =
         (dd_00->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (dd_00->strongref)._q_value.super___atomic_base<int>._M_i =
         (dd_00->strongref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pNVar6 = (this->d).d;
  if ((pNVar6->forwardStack).super_QList<int>.d.size != 0) {
    piVar5 = QStack<int>::top(&pNVar6->forwardStack);
    iVar3 = *piVar5;
    iVar2 = currentIndex(this);
    if (iVar3 == iVar2) goto LAB_00174d29;
    pNVar6 = (this->d).d;
  }
  iVar3 = currentIndex(this);
  QList<int>::append(&(pNVar6->forwardStack).super_QList<int>,iVar3);
  QAbstractButton::setText((QString *)((this->d).d)->right);
  QWidget::show();
LAB_00174d29:
  TextLabel::setText(((this->d).d)->title,&text->title);
  QStackedWidget::setCurrentWidget((QWidget *)((this->d).d)->stack);
  pNVar6 = (this->d).d;
  if ((pNVar6->backStack).super_QList<int>.d.size == 0) {
    QWidget::hide();
  }
  else {
    pQVar1 = pNVar6->stack;
    QStack<int>::top(&pNVar6->backStack);
    local_38 = (QWidget *)QStackedWidget::widget((int)pQVar1);
    pQVar4 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                       (&pNVar6->itemsMap,&local_38);
    dd_01 = pQVar4->d;
    if (dd_01 != (Data *)0x0) {
      LOCK();
      (dd_01->weakref)._q_value.super___atomic_base<int>._M_i =
           (dd_01->weakref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (dd_01->strongref)._q_value.super___atomic_base<int>._M_i =
           (dd_01->strongref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QAbstractButton::setText((QString *)((this->d).d)->left);
    QSharedPointer<QtMWidgets::NavigationItem>::deref(dd_01);
  }
  QSharedPointer<QtMWidgets::NavigationItem>::deref(dd_00);
  QSharedPointer<QtMWidgets::NavigationItem>::deref(dd);
  return;
}

Assistant:

void
NavigationBar::showPreviousScreen()
{
	if( !d->backStack.isEmpty() )
	{
		const int prevIndex = d->backStack.pop();
		QSharedPointer< NavigationItem > prevItem =
			d->itemsMap[ d->stack->widget( prevIndex ) ];
		QSharedPointer< NavigationItem > currentItem =
			d->itemsMap[ d->stack->widget( currentIndex() ) ];

		if( d->forwardStack.isEmpty() || d->forwardStack.top() != currentIndex() )
		{
			d->forwardStack.push( currentIndex() );

			d->right->setText( currentItem->title );
			d->right->show();
		}

		d->title->setText( prevItem->title );

		d->stack->setCurrentWidget( prevItem->self );

		if( !d->backStack.isEmpty() )
		{
			QSharedPointer< NavigationItem > backItem =
				d->itemsMap[ d->stack->widget( d->backStack.top() ) ];

			d->left->setText( backItem->title );
		}
		else
			d->left->hide();
	}
}